

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall
Json::BuiltStyledStreamWriter::BuiltStyledStreamWriter
          (BuiltStyledStreamWriter *this,string *indentation,Enum cs,string *colonSymbol,
          string *nullSymbol,string *endingLineFeedSymbol,bool useSpecialFloats,uint precision)

{
  bool useSpecialFloats_local;
  string *endingLineFeedSymbol_local;
  string *nullSymbol_local;
  string *colonSymbol_local;
  Enum cs_local;
  string *indentation_local;
  BuiltStyledStreamWriter *this_local;
  
  StreamWriter::StreamWriter(&this->super_StreamWriter);
  (this->super_StreamWriter)._vptr_StreamWriter =
       (_func_int **)&PTR__BuiltStyledStreamWriter_00b95030;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->childValues_);
  std::__cxx11::string::string((string *)&this->indentString_);
  this->rightMargin_ = 0x4a;
  std::__cxx11::string::string((string *)&this->indentation_,(string *)indentation);
  this->cs_ = cs;
  std::__cxx11::string::string((string *)&this->colonSymbol_,(string *)colonSymbol);
  std::__cxx11::string::string((string *)&this->nullSymbol_,(string *)nullSymbol);
  std::__cxx11::string::string
            ((string *)&this->endingLineFeedSymbol_,(string *)endingLineFeedSymbol);
  this->field_0xd8 = this->field_0xd8 & 0xfe;
  this->field_0xd8 = this->field_0xd8 & 0xfd;
  this->field_0xd8 = this->field_0xd8 & 0xfb | useSpecialFloats << 2;
  this->precision_ = precision;
  return;
}

Assistant:

BuiltStyledStreamWriter::BuiltStyledStreamWriter(
      JSONCPP_STRING const& indentation,
      CommentStyle::Enum cs,
      JSONCPP_STRING const& colonSymbol,
      JSONCPP_STRING const& nullSymbol,
      JSONCPP_STRING const& endingLineFeedSymbol,
      bool useSpecialFloats,
      unsigned int precision)
  : rightMargin_(74)
  , indentation_(indentation)
  , cs_(cs)
  , colonSymbol_(colonSymbol)
  , nullSymbol_(nullSymbol)
  , endingLineFeedSymbol_(endingLineFeedSymbol)
  , addChildValues_(false)
  , indented_(false)
  , useSpecialFloats_(useSpecialFloats)
  , precision_(precision)
{
}